

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>::update_paging
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *this)

{
  PrimarySlot *this_00;
  uint8_t *puVar1;
  HandledSlot *slot;
  int c;
  uint8_t primary;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *this_local;
  
  slot._7_1_ = this->primary_slots_;
  this->final_slot_ = this->memory_slots_ + ((int)(uint)slot._7_1_ >> 6);
  for (slot._0_4_ = 0; (int)slot < 8; slot._0_4_ = (int)slot + 2) {
    this_00 = &this->memory_slots_[(int)(slot._7_1_ & 3)].super_PrimarySlot;
    slot._7_1_ = (byte)((int)(uint)slot._7_1_ >> 2);
    puVar1 = PrimarySlot::read_pointer(this_00,(int)slot);
    this->read_pointers_[(int)slot] = puVar1;
    puVar1 = PrimarySlot::write_pointer(this_00,(int)slot);
    this->write_pointers_[(int)slot] = puVar1;
    puVar1 = PrimarySlot::read_pointer(this_00,(int)slot + 1);
    this->read_pointers_[(int)slot + 1] = puVar1;
    puVar1 = PrimarySlot::write_pointer(this_00,(int)slot + 1);
    this->write_pointers_[(int)slot + 1] = puVar1;
  }
  set_use_fast_tape(this);
  return;
}

Assistant:

void update_paging() {
			uint8_t primary = primary_slots_;

			// Update final slot; this direct pointer will be used for
			// secondary slot communication.
			final_slot_ = &memory_slots_[primary >> 6];

			for(int c = 0; c < 8; c += 2) {
				const HandledSlot &slot = memory_slots_[primary & 3];
				primary >>= 2;

				read_pointers_[c] = slot.read_pointer(c);
				write_pointers_[c] = slot.write_pointer(c);
				read_pointers_[c+1] = slot.read_pointer(c+1);
				write_pointers_[c+1] = slot.write_pointer(c+1);
			}
			set_use_fast_tape();
		}